

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O3

void jhu::thrax::printRhs<true>(ostream *out,PhrasalRule *rule)

{
  char *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  NT *pNVar5;
  ostream *poVar6;
  long lVar7;
  Rhs *__range2;
  int iVar8;
  PhrasalRule *pPVar9;
  short sVar10;
  Span SVar11;
  NT *pNVar12;
  Rhs nts;
  char local_b9;
  int local_b8;
  Span local_b4;
  Span local_b0;
  int local_ac;
  NT *local_a8;
  AlignedSentencePair *local_a0;
  size_t local_98;
  NT local_90 [4];
  
  local_a0 = rule->sentence;
  pNVar12 = local_90;
  pPVar9 = rule;
  pNVar5 = pNVar12;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    pNVar5->span = (pPVar9->nts)._M_elems[0].span;
    pPVar9 = (PhrasalRule *)&(pPVar9->nts)._M_elems[0].label;
    pNVar5 = (NT *)&pNVar5->label;
  }
  pNVar5 = std::
           __find_if<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::printRhs<true>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>>
                     (pNVar12,&stack0xffffffffffffffd0);
  SVar11 = (rule->lhs).span.src;
  iVar8 = (int)SVar11 >> 0x10;
  iVar4 = (int)SVar11.start;
  if (iVar4 < iVar8) {
    local_b0 = local_90[0].span.src;
    local_b4 = (Span)((uint)local_90[0].span.src >> 0x10);
    local_b8 = iVar4;
    local_ac = iVar8;
    local_a8 = pNVar5;
    do {
      sVar10 = SVar11.start;
      if ((pNVar12 == pNVar5) || (sVar10 < local_b0.start)) {
        if (local_b8 != iVar4) {
          local_b9 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        }
        pbVar2 = (local_a0->src).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar2[sVar10]._M_str,pbVar2[sVar10]._M_len);
        SVar11 = (Span)((int)SVar11 + 1);
      }
      else {
        if ((local_b8 != iVar4) && (local_b8 != local_b0.start)) {
          local_b9 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        }
        local_98 = (pNVar12->label)._M_len;
        pcVar1 = (pNVar12->label)._M_str;
        iVar8 = 1;
        lVar7 = 0;
        do {
          bVar3 = SpanPair::operator==
                            ((SpanPair *)((long)&(rule->nts)._M_elems[0].span.src.start + lVar7),
                             pNVar12->span);
          if (bVar3) goto LAB_001184b7;
          iVar8 = iVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x60);
        iVar8 = 0;
LAB_001184b7:
        local_b9 = '[';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,local_98);
        if (iVar8 != 0) {
          local_b9 = ',';
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
          std::ostream::operator<<(poVar6,iVar8);
        }
        local_b9 = ']';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        pNVar12 = pNVar12 + 1;
        pNVar5 = local_a8;
        SVar11 = local_b4;
        iVar8 = local_ac;
        if (pNVar12 < local_a8) {
          local_b0 = (pNVar12->span).src;
          local_b4 = (Span)((uint)local_b0 >> 0x10);
        }
      }
      iVar4 = (int)SVar11.start;
    } while (iVar4 < iVar8);
  }
  return;
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}